

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaRoberts_dns.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint uVar2;
  N_Vector y;
  long lVar3;
  N_Vector p_Var4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  FILE *__stream;
  char *pcVar10;
  int iVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar12;
  void *mem;
  SUNContext ctx;
  int rootsfound [2];
  sunrealtype tret;
  void *local_78;
  undefined8 local_70;
  uint local_68;
  uint local_64;
  long local_60;
  long local_58;
  long local_50;
  N_Vector local_48;
  double local_40;
  sunrealtype local_38;
  
  local_78 = (void *)0x0;
  uVar1 = SUNContext_Create(0,&local_70);
  if ((int)uVar1 < 0) {
    pcVar10 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(3,local_70);
    if (y == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    lVar3 = N_VClone(y);
    if (lVar3 == 0) {
      main_cold_6();
      return 1;
    }
    p_Var4 = (N_Vector)N_VClone(y);
    if (p_Var4 == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    puVar5 = (undefined8 *)N_VGetArrayPointer(y);
    *puVar5 = 0x3ff0000000000000;
    puVar5[1] = 0;
    puVar5[2] = 0;
    puVar6 = (undefined4 *)N_VGetArrayPointer(lVar3);
    *puVar6 = 0x47ae147b;
    puVar6[1] = 0xbfa47ae1;
    puVar6[2] = 0x47ae147b;
    puVar6[3] = 0x3fa47ae1;
    *(undefined8 *)(puVar6 + 4) = 0;
    puVar5 = (undefined8 *)N_VGetArrayPointer(p_Var4);
    *puVar5 = 0x3e45798ee2308c3a;
    puVar5[1] = 0x3eb0c6f7a0b5ed8d;
    puVar5[2] = 0x3eb0c6f7a0b5ed8d;
    PrintHeader(1e-08,p_Var4,y);
    local_78 = (void *)IDACreate(local_70);
    if (local_78 == (void *)0x0) {
      main_cold_4();
      return 1;
    }
    uVar1 = IDAInit(0,local_78,resrob,y,lVar3);
    if ((int)uVar1 < 0) {
      pcVar10 = "IDAInit";
    }
    else {
      uVar1 = IDASVtolerances(0xeb1c432d,local_78,p_Var4);
      if ((int)uVar1 < 0) {
        pcVar10 = "IDASVtolerances";
      }
      else {
        uVar1 = IDARootInit(local_78,2,grob);
        if ((int)uVar1 < 0) {
          pcVar10 = "IDARootInit";
        }
        else {
          lVar7 = SUNDenseMatrix(3,3,local_70);
          if (lVar7 == 0) {
            main_cold_3();
            return 1;
          }
          lVar8 = SUNLinSol_Dense(y,lVar7,local_70);
          if (lVar8 == 0) {
            main_cold_2();
            return 1;
          }
          uVar1 = IDASetLinearSolver(local_78,lVar8,lVar7);
          if ((int)uVar1 < 0) {
            pcVar10 = "IDASetLinearSolver";
          }
          else {
            uVar1 = IDASetJacFn(local_78,jacrob);
            if ((int)uVar1 < 0) {
              pcVar10 = "IDASetJacFn";
            }
            else {
              lVar9 = SUNNonlinSol_Newton(y,local_70);
              if (lVar9 == 0) {
                main_cold_1();
                return 1;
              }
              uVar1 = IDASetNonlinearSolver(local_78,lVar9);
              if ((int)uVar1 < 0) {
                pcVar10 = "IDASetNonlinearSolver";
              }
              else {
                dVar12 = 0.4;
                iVar11 = 0;
                local_60 = lVar9;
                local_58 = lVar8;
                local_50 = lVar7;
                local_48 = p_Var4;
                while( true ) {
                  local_40 = dVar12;
                  uVar1 = IDASolve(local_78,&local_38,y,lVar3,1);
                  PrintOutput(local_78,local_38,y);
                  if ((int)uVar1 < 0) break;
                  if (uVar1 == 2) {
                    uVar2 = IDAGetRootInfo(local_78,&local_68);
                    if ((int)uVar2 < 0) {
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                              "IDAGetRootInfo",(ulong)uVar2);
                    }
                    printf("    rootsfound[] = %3d %3d\n",(ulong)local_68,(ulong)local_64);
                  }
                  dVar12 = local_40 * 10.0;
                  if (uVar1 != 0) {
                    dVar12 = local_40;
                  }
                  iVar11 = iVar11 + (uint)(uVar1 == 0);
                  if (iVar11 == 0xc) {
                    dVar12 = local_40;
                    puts("\nFinal Statistics:");
                    IDAPrintAllStats(local_78,_stdout,0);
                    __stream = fopen("idaRoberts_dns_stats.csv","w");
                    IDAPrintAllStats(local_78,__stream,1);
                    fclose(__stream);
                    p_Var4 = local_48;
                    iVar11 = check_ans(y,(sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),
                                       dVar12,local_48);
                    IDAFree(&local_78);
                    SUNNonlinSolFree(local_60);
                    SUNLinSolFree(local_58);
                    SUNMatDestroy(local_50);
                    N_VDestroy(p_Var4);
                    N_VDestroy(y);
                    N_VDestroy(lVar3);
                    SUNContext_Free(&local_70);
                    return iVar11;
                  }
                }
                pcVar10 = "IDASolve";
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  void* mem;
  N_Vector yy, yp, avtol;
  sunrealtype rtol, *yval, *ypval, *atval;
  sunrealtype t0, tout1, tout, tret;
  int iout, retval, retvalr;
  int rootsfound[2];
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  SUNContext ctx;
  FILE* FID;

  mem = NULL;
  yy = yp = avtol = NULL;
  yval = ypval = atval = NULL;
  A                    = NULL;
  LS                   = NULL;
  NLS                  = NULL;

  /* Create SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }
  avtol = N_VClone(yy);
  if (check_retval((void*)avtol, "N_VNew_Serial", 0)) { return (1); }

  /* Create and initialize  y, y', and absolute tolerance vectors. */
  yval    = N_VGetArrayPointer(yy);
  yval[0] = ONE;
  yval[1] = ZERO;
  yval[2] = ZERO;

  ypval    = N_VGetArrayPointer(yp);
  ypval[0] = SUN_RCONST(-0.04);
  ypval[1] = SUN_RCONST(0.04);
  ypval[2] = ZERO;

  rtol = SUN_RCONST(1.0e-4);

  atval    = N_VGetArrayPointer(avtol);
  atval[0] = SUN_RCONST(1.0e-8);
  atval[1] = SUN_RCONST(1.0e-6);
  atval[2] = SUN_RCONST(1.0e-6);

  /* Integration limits */
  t0    = ZERO;
  tout1 = SUN_RCONST(0.4);

  PrintHeader(rtol, avtol, yy);

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }
  retval = IDAInit(mem, resrob, t0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }
  /* Call IDASVtolerances to set tolerances */
  retval = IDASVtolerances(mem, rtol, avtol);
  if (check_retval(&retval, "IDASVtolerances", 1)) { return (1); }

  /* Call IDARootInit to specify the root function grob with 2 components */
  retval = IDARootInit(mem, 2, grob);
  if (check_retval(&retval, "IDARootInit", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFn(mem, jacrob);
  if (check_retval(&retval, "IDASetJacFn", 1)) { return (1); }

  /* Create Newton SUNNonlinearSolver object. IDA uses a
   * Newton SUNNonlinearSolver by default, so it is unecessary
   * to create it and attach it. It is done in this example code
   * solely for demonstration purposes. */
  NLS = SUNNonlinSol_Newton(yy, ctx);
  if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* Attach the nonlinear solver */
  retval = IDASetNonlinearSolver(mem, NLS);
  if (check_retval(&retval, "IDASetNonlinearSolver", 1)) { return (1); }

  /* In loop, call IDASolve, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached. */

  iout = 0;
  tout = tout1;
  while (1)
  {
    retval = IDASolve(mem, tout, &tret, yy, yp, IDA_NORMAL);

    PrintOutput(mem, tret, yy);

    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    if (retval == IDA_ROOT_RETURN)
    {
      retvalr = IDAGetRootInfo(mem, rootsfound);
      check_retval(&retvalr, "IDAGetRootInfo", 1);
      PrintRootInfo(rootsfound[0], rootsfound[1]);
    }

    if (retval == IDA_SUCCESS)
    {
      iout++;
      tout *= SUN_RCONST(10.0);
    }

    if (iout == NOUT) { break; }
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idaRoberts_dns_stats.csv", "w");
  retval = IDAPrintAllStats(mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* check the solution error */
  retval = check_ans(yy, tret, rtol, avtol);

  /* Free memory */
  IDAFree(&mem);
  SUNNonlinSolFree(NLS);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(avtol);
  N_VDestroy(yy);
  N_VDestroy(yp);
  SUNContext_Free(&ctx);

  return (retval);
}